

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

void __thiscall cppcms::session_interface::validate_request_origin(session_interface *this)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  level_type lVar4;
  request *prVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  difference_type dVar6;
  cppcms_error *this_01;
  ostream *poVar7;
  request_forgery_error *this_02;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar8;
  string local_d0;
  string token;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->context_ == (context *)0x0) {
    this_01 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_d0,"request origin validation isn\'t possible without http::context"
               ,(allocator *)&token);
    cppcms_error::cppcms_error(this_01,&local_d0);
    __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  uVar1 = *(uint *)&this->field_0x80;
  if ((uVar1 & 0x20) != 0) {
    return;
  }
  *(uint *)&this->field_0x80 = uVar1 | 0x20;
  if ((~uVar1 & 0xc0) != 0) {
    return;
  }
  prVar5 = http::context::request(this->context_);
  http::request::request_method_abi_cxx11_(&local_d0,prVar5);
  bVar2 = std::operator!=(&local_d0,"POST");
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar2) {
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    prVar5 = http::context::request(this->context_);
    this_00 = &http::request::post_abi_cxx11_(prVar5)->_M_t;
    std::__cxx11::string::string((string *)&local_d0,"_csrf",(allocator *)&local_80);
    pVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(this_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if ((pVar8.first._M_node._M_node == pVar8.second._M_node._M_node) ||
       (dVar6 = std::
                __distance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          (pVar8.first._M_node._M_node,pVar8.second._M_node._M_node), dVar6 != 1)) {
      prVar5 = http::context::request(this->context_);
      http::request::getenv_abi_cxx11_((request *)&local_d0,(char *)prVar5);
      std::__cxx11::string::operator=((string *)&token,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&token);
    }
    bVar2 = validate_csrf_token(this,&token);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&token);
      return;
    }
    lVar4 = booster::log::logger::instance();
    cVar3 = booster::log::logger::should_be_logged(lVar4,(char *)0x28);
    if (cVar3 != '\0') {
      booster::log::message::message
                ((message *)&local_d0,warning,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/session_interface.cpp"
                 ,0x90);
      poVar7 = (ostream *)booster::log::message::out();
      poVar7 = std::operator<<(poVar7,"CSRF validation failed");
      poVar7 = std::operator<<(poVar7," IP=");
      prVar5 = http::context::request(this->context_);
      http::request::remote_addr_abi_cxx11_(&local_80,prVar5);
      poVar7 = std::operator<<(poVar7,(string *)&local_80);
      poVar7 = std::operator<<(poVar7," SCRIPT_NAME=");
      prVar5 = http::context::request(this->context_);
      http::request::script_name_abi_cxx11_(&local_40,prVar5);
      poVar7 = std::operator<<(poVar7,(string *)&local_40);
      poVar7 = std::operator<<(poVar7," PATH_INFO=");
      prVar5 = http::context::request(this->context_);
      http::request::path_info_abi_cxx11_(&local_60,prVar5);
      std::operator<<(poVar7,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
      booster::log::message::~message((message *)&local_d0);
    }
    this_02 = (request_forgery_error *)__cxa_allocate_exception(0x30);
    request_forgery_error::request_forgery_error(this_02);
    __cxa_throw(this_02,&request_forgery_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void session_interface::validate_request_origin()
{
	if(!context_)
		throw cppcms_error("request origin validation isn't possible without http::context");
	if(csrf_checked_)
		return;
	csrf_checked_ = 1;

	if(!csrf_validation_)
		return;
	if(!csrf_do_validation_)
		return;
	if(context_->request().request_method()!="POST")
		return;
	
	std::string token;
	
	typedef http::request::form_type::const_iterator iterator_type;
	std::pair<iterator_type,iterator_type> pair=context_->request().post().equal_range("_csrf");

	if(pair.first != pair.second && std::distance(pair.first,pair.second)==1)
		token = pair.first->second;
	else
		token = context_->request().getenv("HTTP_X_CSRFTOKEN");
	
	if(!validate_csrf_token(token)) {
		BOOSTER_WARNING("cppcms")	<<"CSRF validation failed"
						<<" IP="<< context_->request().remote_addr() 
						<<" SCRIPT_NAME=" << context_->request().script_name() 
						<<" PATH_INFO="<<context_->request().path_info();  
		throw request_forgery_error();
	}
}